

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O2

void __thiscall
ctemplate::StaticTemplateStringInitializer::StaticTemplateStringInitializer
          (StaticTemplateStringInitializer *this,StaticTemplateString *sts)

{
  char *pcVar1;
  size_t sVar2;
  TemplateString ts_copy_of_sts;
  TemplateString local_38;
  
  pcVar1 = (sts->do_not_use_directly_).ptr_;
  local_38.id_ = (sts->do_not_use_directly_).id_;
  if (local_38.id_ == 0) {
    sVar2 = (sts->do_not_use_directly_).length_;
    local_38.is_immutable_ = true;
    local_38.id_ = 0;
    local_38.ptr_ = pcVar1;
    local_38.length_ = sVar2;
    local_38.id_ = TemplateString::GetGlobalId(&local_38);
    (sts->do_not_use_directly_).id_ = local_38.id_;
  }
  else {
    sVar2 = (sts->do_not_use_directly_).length_;
  }
  local_38.is_immutable_ = true;
  local_38.ptr_ = pcVar1;
  local_38.length_ = sVar2;
  TemplateString::AddToGlobalIdToNameMap(&local_38);
  return;
}

Assistant:

StaticTemplateStringInitializer::StaticTemplateStringInitializer(
    const StaticTemplateString* sts) {
  // Compute the sts's id if it wasn't specified at static-init
  // time.  If it was specified at static-init time, verify it's
  // correct.  This is necessary because static-init id's are, by
  // nature, pre-computed, and the id-generating algorithm may have
  // changed between the time they were computed and now.
  if (sts->do_not_use_directly_.id_ == 0) {
    sts->do_not_use_directly_.id_ = TemplateString(*sts).GetGlobalId();
  } else {
    // Don't use the TemplateString(const StaticTemplateString& sts)
    // constructor below, since if we do, GetGlobalId will just return
    // sts->do_not_use_directly_.id_ and the check will be pointless.
    DCHECK_EQ(TemplateString(sts->do_not_use_directly_.ptr_,
                             sts->do_not_use_directly_.length_).GetGlobalId(),
              sts->do_not_use_directly_.id_);
  }

  // Now add this id/name pair to the backwards map from id to name.
  TemplateString ts_copy_of_sts(*sts);
  ts_copy_of_sts.AddToGlobalIdToNameMap();
}